

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * str_hasnextword(char *buffer,char *word)

{
  char *pcVar1;
  ushort *puVar2;
  char cVar3;
  ushort **ppuVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  
  if (buffer != (char *)0x0) {
    ppuVar4 = __ctype_b_loc();
    puVar2 = *ppuVar4;
    do {
      pcVar6 = buffer;
      cVar3 = *pcVar6;
      buffer = pcVar6 + 1;
    } while ((puVar2[cVar3] & 1) != 0);
    cVar7 = *word;
    if (cVar7 != '\0') {
      lVar8 = -1;
      do {
        lVar9 = (long)buffer[lVar8];
        if (lVar9 == 0) {
          return (char *)0x0;
        }
        if ((puVar2[lVar9] & 1) != 0) {
          return (char *)0x0;
        }
        pp_Var5 = __ctype_tolower_loc();
        if ((*pp_Var5)[cVar7] != (*pp_Var5)[lVar9]) {
          return (char *)0x0;
        }
        cVar7 = word[lVar8 + 2];
        lVar8 = lVar8 + 1;
      } while (cVar7 != '\0');
      pcVar6 = buffer + lVar8;
      cVar3 = buffer[lVar8];
    }
    if ((cVar3 == '\0') || ((puVar2[cVar3] & 1) != 0)) {
      pcVar6 = pcVar6 + -1;
      do {
        pcVar1 = pcVar6 + 1;
        pcVar6 = pcVar6 + 1;
      } while ((puVar2[*pcVar1] & 1) != 0);
      return pcVar6;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *
str_hasnextword(const char *buffer, const char *word) {
  /* sanity check */
  if (buffer == NULL) {
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*buffer)) {
    buffer++;
  }

  while (*word != 0 && *buffer != 0 && !isblank(*buffer) && tolower(*word) == tolower(*buffer)) {
    word++;
    buffer++;
  }

  /* complete match ? */
  if (*word == 0 && (*buffer == 0 || isblank(*buffer))) {
    while (isblank(*buffer)) {
      buffer++;
    }
    return buffer;
  }
  return NULL;
}